

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_functor.cpp
# Opt level: O2

void __thiscall
product_functor<float>::product_functor(product_functor<float> *this,float a,float b)

{
  ostream *poVar1;
  string local_30 [32];
  
  this->m_a = a;
  this->m_b = b;
  poVar1 = std::operator<<((ostream *)&std::cout,"Type: ");
  name_of_type<float>();
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,". Computing the product of ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,a);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,b);
  std::operator<<(poVar1,".");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

product_functor(scalar a, scalar b) : m_a(a), m_b(b)
    {
        std::cout << "Type: " << name_of_type<scalar>() << ". Computing the product of " << a << " and " << b << ".";
    }